

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               inverse *transform)

{
  triplet<unsigned_char> triplet_value;
  quad<unsigned_char> local_34;
  inverse *local_30;
  size_t i;
  inverse *transform_local;
  size_t pixel_count_local;
  quad<unsigned_char> *source_local;
  quad<unsigned_char> *destination_local;
  
  i = (size_t)transform;
  transform_local = (inverse *)pixel_count;
  pixel_count_local = (size_t)source;
  source_local = destination;
  for (local_30 = (inverse *)0x0; local_30 < transform_local; local_30 = local_30 + 1) {
    triplet_value =
         transform_hp3<unsigned_char>::inverse::operator()
                   ((inverse *)i,(uint)*(byte *)(pixel_count_local + (long)local_30 * 4),
                    (uint)*(byte *)(pixel_count_local + 1 + (long)local_30 * 4),
                    (uint)*(byte *)(pixel_count_local + 2 + (long)local_30 * 4));
    quad<unsigned_char>::quad
              (&local_34,triplet_value,(uint)*(byte *)(pixel_count_local + 3 + (long)local_30 * 4));
    source_local[(long)local_30] = local_34;
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = quad<PixelType>(transform(source[i].v1, source[i].v2, source[i].v3), source[i].v4);
    }
}